

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadsBody.cpp
# Opt level: O1

void __thiscall
chrono::ChLoadBodyBodyBushingSpherical::ChLoadBodyBodyBushingSpherical
          (ChLoadBodyBodyBushingSpherical *this,shared_ptr<chrono::ChBody> *bodyA,
          shared_ptr<chrono::ChBody> *bodyB,ChFrame<double> *abs_application,
          ChVector<double> *mstiffness,ChVector<double> *mdamping)

{
  shared_ptr<chrono::ChBody> local_38;
  shared_ptr<chrono::ChBody> local_28;
  
  local_28.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (bodyA->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_28.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (bodyA->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_28.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_28.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_28.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_28.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_28.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_38.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (bodyB->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_38.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (bodyB->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_38.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_38.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_38.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_38.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_38.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  ChLoadBodyBody::ChLoadBodyBody(&this->super_ChLoadBodyBody,&local_28,&local_38,abs_application);
  if (local_38.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_28.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  (this->super_ChLoadBodyBody).super_ChLoadCustomMultiple.super_ChLoadBase.super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChLoadBodyBody_00b490a8;
  (this->stiffness).m_data[0] = mstiffness->m_data[0];
  (this->stiffness).m_data[1] = mstiffness->m_data[1];
  (this->stiffness).m_data[2] = mstiffness->m_data[2];
  (this->damping).m_data[0] = mdamping->m_data[0];
  (this->damping).m_data[1] = mdamping->m_data[1];
  (this->damping).m_data[2] = mdamping->m_data[2];
  return;
}

Assistant:

ChLoadBodyBodyBushingSpherical::ChLoadBodyBodyBushingSpherical(std::shared_ptr<ChBody> bodyA,
                                                               std::shared_ptr<ChBody> bodyB,
                                                               const ChFrame<>& abs_application,
                                                               const ChVector<>& mstiffness,
                                                               const ChVector<>& mdamping)
    : ChLoadBodyBody(bodyA, bodyB, abs_application), stiffness(mstiffness), damping(mdamping) {}